

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

void Assimp::FindSceneCenter(aiScene *scene,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  uint i;
  ulong uVar1;
  aiVector3t<float> aVar2;
  aiVector3D local_68;
  aiVector3D local_58;
  aiVector3D *local_48;
  aiVector3D local_40;
  
  if ((scene != (aiScene *)0x0) && (scene->mNumMeshes != 0)) {
    local_48 = out;
    FindMeshCenter(*scene->mMeshes,out,min,max);
    for (uVar1 = 1; uVar1 < scene->mNumMeshes; uVar1 = uVar1 + 1) {
      local_58.x = 0.0;
      local_58.y = 0.0;
      local_58.z = 0.0;
      local_68.x = 0.0;
      local_68.y = 0.0;
      local_68.z = 0.0;
      FindMeshCenter(scene->mMeshes[uVar1],&local_40,&local_58,&local_68);
      if (local_58.x < min->x) {
        min->x = local_58.x;
      }
      if (local_58.y < min->y) {
        min->y = local_58.y;
      }
      if (local_58.z < min->z) {
        min->z = local_58.z;
      }
      if (max->x <= local_68.x && local_68.x != max->x) {
        max->x = local_68.x;
      }
      if (max->y <= local_68.y && local_68.y != max->y) {
        max->y = local_68.y;
      }
      if (max->z <= local_68.z && local_68.z != max->z) {
        max->z = local_68.z;
      }
    }
    aVar2 = operator-(max,min);
    local_40.x = aVar2.x * 0.5;
    local_40.y = aVar2.y * 0.5;
    local_40.z = aVar2.z * 0.5;
    aVar2 = operator+(min,&local_40);
    local_48->x = aVar2.x;
    local_48->y = aVar2.y;
    local_48->z = aVar2.z;
  }
  return;
}

Assistant:

void FindSceneCenter (aiScene* scene, aiVector3D& out, aiVector3D& min, aiVector3D& max) {
    if ( NULL == scene ) {
        return;
    }

    if ( 0 == scene->mNumMeshes ) {
        return;
    }
    FindMeshCenter(scene->mMeshes[0], out, min, max);
    for (unsigned int i = 1; i < scene->mNumMeshes; ++i) {
        aiVector3D tout, tmin, tmax;
        FindMeshCenter(scene->mMeshes[i], tout, tmin, tmax);
        if (min[0] > tmin[0]) min[0] = tmin[0];
        if (min[1] > tmin[1]) min[1] = tmin[1];
        if (min[2] > tmin[2]) min[2] = tmin[2];
        if (max[0] < tmax[0]) max[0] = tmax[0];
        if (max[1] < tmax[1]) max[1] = tmax[1];
        if (max[2] < tmax[2]) max[2] = tmax[2];
    }
    out = min + (max-min)*(ai_real)0.5;
}